

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_fma_functor::unary_op_abs>(Mat *a,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  int iVar5;
  long *in_RDI;
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_abs op;
  Mat *m;
  __m256 abs_mask;
  __m128 abs_mask_1;
  int local_3a0;
  undefined1 (*local_348) [32];
  int local_340;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  
  lVar4 = in_RDI[7];
  iVar5 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
          (int)in_RDI[3];
  for (local_340 = 0; local_340 < (int)lVar4; local_340 = local_340 + 1) {
    local_348 = (undefined1 (*) [32])(*in_RDI + in_RDI[8] * (long)local_340 * in_RDI[2]);
    for (local_3a0 = 0; local_3a0 + 7 < iVar5; local_3a0 = local_3a0 + 8) {
      auVar2 = vpinsrd_avx(ZEXT416(0x7fffffff),0x7fffffff,1);
      auVar2 = vpinsrd_avx(auVar2,0x7fffffff,2);
      auVar2 = vpinsrd_avx(auVar2,0x7fffffff,3);
      auVar3 = vpinsrd_avx(ZEXT416(0x7fffffff),0x7fffffff,1);
      auVar3 = vpinsrd_avx(auVar3,0x7fffffff,2);
      auVar3 = vpinsrd_avx(auVar3,0x7fffffff,3);
      uStack_f0 = auVar2._0_8_;
      uStack_e8 = auVar2._8_8_;
      auVar1._16_8_ = uStack_f0;
      auVar1._0_16_ = auVar3;
      auVar1._24_8_ = uStack_e8;
      auVar1 = vandps_avx(auVar1,*local_348);
      *local_348 = auVar1;
      local_348 = local_348 + 1;
    }
    for (; local_3a0 + 3 < iVar5; local_3a0 = local_3a0 + 4) {
      auVar2 = vpinsrd_avx(ZEXT416(0x7fffffff),0x7fffffff,1);
      auVar2 = vpinsrd_avx(auVar2,0x7fffffff,2);
      auVar2 = vpinsrd_avx(auVar2,0x7fffffff,3);
      auVar2 = vpand_avx(auVar2,*(undefined1 (*) [16])*local_348);
      *(undefined1 (*) [16])*local_348 = auVar2;
      local_348 = (undefined1 (*) [32])(*local_348 + 0x10);
    }
    for (; local_3a0 < iVar5; local_3a0 = local_3a0 + 1) {
      auVar2 = vpand_avx(ZEXT416(*(uint *)*local_348),_DAT_01f9d040);
      *(int *)*local_348 = auVar2._0_4_;
      local_348 = (undefined1 (*) [32])(*local_348 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}